

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

uint8_t * google::protobuf::internal::
          MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)3>
          ::InternalSerialize(int field_number,
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                             long *value,uint8_t *ptr,EpsCopyOutputStream *stream)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  long lVar3;
  byte *pbVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar10 = field_number << 3;
  *ptr = (byte)uVar10 + 2;
  if (uVar10 < 0x80) {
    pbVar6 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar10 | 0x82;
    ptr[1] = (byte)(uVar10 >> 7);
    pbVar6 = ptr + 2;
    if (0x3fff < uVar10) {
      uVar7 = (uint)ptr[1];
      uVar10 = uVar10 >> 7;
      do {
        pbVar6[-1] = (byte)uVar7 | 0x80;
        uVar7 = uVar10 >> 7;
        *pbVar6 = (byte)uVar7;
        pbVar6 = pbVar6 + 1;
        bVar1 = 0x3fff < uVar10;
        uVar10 = uVar7;
      } while (bVar1);
    }
  }
  uVar10 = (uint)key->_M_string_length;
  uVar7 = uVar10 | 1;
  iVar2 = 0x1f;
  if (uVar7 != 0) {
    for (; uVar7 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  lVar3 = 0x3f;
  if ((*value | 1U) != 0) {
    for (; (*value | 1U) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  uVar10 = (iVar2 * 9 + 0x49U >> 6) + uVar10 + ((int)lVar3 * 9 + 0x49U >> 6) + 2;
  *pbVar6 = (byte)uVar10;
  if (uVar10 < 0x80) {
    pbVar4 = pbVar6 + 1;
  }
  else {
    *pbVar6 = (byte)uVar10 | 0x80;
    pbVar6[1] = (byte)(uVar10 >> 7);
    pbVar4 = pbVar6 + 2;
    if (0x3fff < uVar10) {
      uVar7 = (uint)pbVar6[1];
      uVar10 = uVar10 >> 7;
      do {
        pbVar4[-1] = (byte)uVar7 | 0x80;
        uVar7 = uVar10 >> 7;
        *pbVar4 = (byte)uVar7;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar10;
        uVar10 = uVar7;
      } while (bVar1);
    }
  }
  if (stream->end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar4);
  }
  __n = key->_M_string_length;
  if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)pbVar4)))) {
    *pbVar4 = 10;
    pbVar4[1] = (byte)__n;
    memcpy(pbVar4 + 2,(key->_M_dataplus)._M_p,__n);
    pbVar4 = pbVar4 + __n + 2;
  }
  else {
    pbVar4 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,key,pbVar4);
  }
  if (stream->end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar4);
  }
  uVar8 = *value;
  *pbVar4 = 0x10;
  pbVar4[1] = (byte)uVar8;
  if (uVar8 < 0x80) {
    pbVar6 = pbVar4 + 2;
  }
  else {
    pbVar4[1] = (byte)uVar8 | 0x80;
    pbVar4[2] = (byte)(uVar8 >> 7);
    pbVar6 = pbVar4 + 3;
    if (0x3fff < uVar8) {
      uVar9 = (ulong)pbVar4[2];
      uVar8 = uVar8 >> 7;
      do {
        pbVar6[-1] = (byte)uVar9 | 0x80;
        uVar5 = uVar8 >> 7;
        *pbVar6 = (byte)uVar5;
        pbVar6 = pbVar6 + 1;
        uVar9 = uVar5 & 0xffffffff;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar5;
      } while (bVar1);
    }
  }
  return pbVar6;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }